

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::Matches
          (OnCallSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *in_RDI;
  tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_> *in_stack_00000008;
  MatcherBase<const_std::tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_>_&> *in_stack_00000010;
  tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_> *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<TestExprBuilder<0,BasicTestExpr<0>>>>,std::tuple<TestExprBuilder<0,BasicTestExpr<0>>>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_>_&>::Matches
                         (in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }